

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_connection_state(Curl_easy *data,_Bool *done)

{
  int iVar1;
  undefined4 uVar2;
  _Bool local_51;
  smb_header *psStack_50;
  _Bool ssl_done;
  void *msg;
  smb_header *psStack_40;
  CURLcode result;
  smb_header *h;
  smb_negotiate_response *nrsp;
  smb_conn *smbc;
  connectdata *conn;
  _Bool *done_local;
  Curl_easy *data_local;
  
  smbc = (smb_conn *)data->conn;
  nrsp = (smb_negotiate_response *)&((connectdata *)smbc)->proto;
  psStack_50 = (smb_header *)0x0;
  conn = (connectdata *)done;
  done_local = (_Bool *)data;
  if (((smb_conn *)nrsp)->state == SMB_CONNECTING) {
    if ((((connectdata *)smbc)->handler->flags & 1) != 0) {
      local_51 = false;
      msg._4_4_ = Curl_conn_connect(data,0,false,&local_51);
      if ((msg._4_4_ != CURLE_OK) && (msg._4_4_ != CURLE_AGAIN)) {
        return msg._4_4_;
      }
      if ((local_51 & 1U) == 0) {
        return CURLE_OK;
      }
    }
    msg._4_4_ = smb_send_negotiate((Curl_easy *)done_local);
    if (msg._4_4_ != CURLE_OK) {
      Curl_conncontrol((connectdata *)smbc,1);
      return msg._4_4_;
    }
    conn_state((Curl_easy *)done_local,SMB_NEGOTIATE);
  }
  msg._4_4_ = smb_send_and_recv((Curl_easy *)done_local,&stack0xffffffffffffffb0);
  if ((msg._4_4_ == CURLE_OK) || (msg._4_4_ == CURLE_AGAIN)) {
    if (psStack_50 == (smb_header *)0x0) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      psStack_40 = psStack_50;
      iVar1._0_1_ = (nrsp->h).nbt_type;
      iVar1._1_1_ = (nrsp->h).nbt_flags;
      iVar1._2_2_ = (nrsp->h).nbt_length;
      if (iVar1 == 2) {
        if ((*(ulong *)(nrsp[1].h.magic + 2) < 0x51) || (psStack_50->status != 0)) {
          Curl_conncontrol((connectdata *)smbc,1);
          return CURLE_COULDNT_CONNECT;
        }
        h = psStack_50;
        *(undefined8 *)&(nrsp->h).uid = *(undefined8 *)&psStack_50[2].nbt_flags;
        uVar2._0_2_ = psStack_50[1].pid_high;
        uVar2._2_1_ = psStack_50[1].signature[0];
        uVar2._3_1_ = psStack_50[1].signature[1];
        nrsp->max_mpx_count = (undefined2)uVar2;
        nrsp->max_number_vcs = (short)((uint)uVar2 >> 0x10);
        msg._4_4_ = smb_send_setup((Curl_easy *)done_local);
        if (msg._4_4_ != CURLE_OK) {
          Curl_conncontrol((connectdata *)smbc,1);
          return msg._4_4_;
        }
        conn_state((Curl_easy *)done_local,SMB_SETUP);
      }
      else {
        if (iVar1 != 3) {
          smb_pop_message((connectdata *)smbc);
          return CURLE_OK;
        }
        if (psStack_50->status != 0) {
          Curl_conncontrol((connectdata *)smbc,1);
          return CURLE_LOGIN_DENIED;
        }
        *(unsigned_short *)&nrsp->max_buffer_size = psStack_50->uid;
        conn_state((Curl_easy *)done_local,SMB_CONNECTED);
        *(undefined1 *)&(conn->bundle_node).ptr = 1;
      }
      smb_pop_message((connectdata *)smbc);
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    Curl_conncontrol((connectdata *)smbc,1);
    data_local._4_4_ = msg._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_connection_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_negotiate_response *nrsp;
  struct smb_header *h;
  CURLcode result;
  void *msg = NULL;

  if(smbc->state == SMB_CONNECTING) {
#ifdef USE_SSL
    if((conn->handler->flags & PROTOPT_SSL)) {
      bool ssl_done = FALSE;
      result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssl_done);
      if(result && result != CURLE_AGAIN)
        return result;
      if(!ssl_done)
        return CURLE_OK;
    }
#endif

    result = smb_send_negotiate(data);
    if(result) {
      connclose(conn, "SMB: failed to send negotiate message");
      return result;
    }

    conn_state(data, SMB_NEGOTIATE);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(smbc->state) {
  case SMB_NEGOTIATE:
    if((smbc->got < sizeof(*nrsp) + sizeof(smbc->challenge) - 1) ||
       h->status) {
      connclose(conn, "SMB: negotiation failed");
      return CURLE_COULDNT_CONNECT;
    }
    nrsp = msg;
    memcpy(smbc->challenge, nrsp->bytes, sizeof(smbc->challenge));
    smbc->session_key = smb_swap32(nrsp->session_key);
    result = smb_send_setup(data);
    if(result) {
      connclose(conn, "SMB: failed to send setup message");
      return result;
    }
    conn_state(data, SMB_SETUP);
    break;

  case SMB_SETUP:
    if(h->status) {
      connclose(conn, "SMB: authentication failed");
      return CURLE_LOGIN_DENIED;
    }
    smbc->uid = smb_swap16(h->uid);
    conn_state(data, SMB_CONNECTED);
    *done = true;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  return CURLE_OK;
}